

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O1

euler euler_from_quat(quaternion *in_quat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_4_2_5f91f90e_for_euler__4 aVar5;
  float fVar6;
  euler eVar7;
  
  if (in_quat == (quaternion *)0x0) {
    euler_from_quat_cold_1();
    aVar5.yaw = 0.0;
    fVar3 = 0.0;
    fVar6 = 0.0;
  }
  else {
    fVar6 = (in_quat->field_1).dual.x;
    fVar3 = (in_quat->field_1).dual.y;
    fVar2 = (in_quat->field_0).w * fVar6 + (in_quat->field_1).dual.z * fVar3;
    fVar6 = fVar6 * fVar6 + fVar3 * fVar3;
    fVar3 = atan2f(fVar2 + fVar2,1.0 - (fVar6 + fVar6));
    fVar6 = (in_quat->field_0).w * (in_quat->field_1).dual.y +
            (in_quat->field_1).dual.x * (in_quat->field_1).dual.z;
    fVar6 = asinf(fVar6 + fVar6);
    fVar2 = (in_quat->field_1).dual.y;
    fVar1 = (in_quat->field_1).dual.z;
    fVar4 = (in_quat->field_0).w * fVar1 + (in_quat->field_1).dual.x * fVar2;
    fVar2 = fVar2 * fVar2 + fVar1 * fVar1;
    aVar5.yaw = atan2f(fVar4 + fVar4,1.0 - (fVar2 + fVar2));
  }
  eVar7.field_1.pitch = fVar6;
  eVar7.field_0.roll = fVar3;
  eVar7.field_2.yaw = aVar5.yaw;
  return eVar7;
}

Assistant:

euler euler_from_quat(const quaternion *in_quat) {
    euler temp = {0.f};

    if (!in_quat)  // if null
    {
        fprintf(stderr, "%s: Invalid input.", __func__);
        return temp;
    }

    temp.roll = atan2f(
        2.f * (in_quat->w * in_quat->q1 + in_quat->q2 * in_quat->q3),
        1.f - 2.f * (in_quat->q1 * in_quat->q1 + in_quat->q2 * in_quat->q2));
    temp.pitch =
        asinf(2.f * (in_quat->w * in_quat->q2 + in_quat->q1 * in_quat->q3));
    temp.yaw = atan2f(
        2.f * (in_quat->w * in_quat->q3 + in_quat->q1 * in_quat->q2),
        1.f - 2.f * (in_quat->q2 * in_quat->q2 + in_quat->q3 * in_quat->q3));

    return temp;
}